

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void fadst8x16_new_avx2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i *palVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  undefined7 in_register_00000011;
  uint uVar22;
  long lVar23;
  uint uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i temp1;
  __m256i in0;
  __m256i __rounding_256;
  __m128i temp3;
  __m128i temp2;
  __m128i temp0;
  __m256i cospi_arr [20];
  __m256i in1;
  int8_t local_541;
  __m256i *local_540;
  __m256i *local_538;
  int local_52c;
  uint local_528;
  int local_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  longlong local_420;
  longlong lStack_418;
  __m128i *local_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  __m256i local_3c0;
  int local_3a0;
  int iStack_39c;
  int iStack_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int iStack_388;
  int iStack_384;
  int local_380;
  undefined4 uStack_37c;
  longlong lStack_378;
  longlong lStack_370;
  longlong lStack_368;
  int local_360;
  undefined4 uStack_35c;
  longlong lStack_358;
  longlong lStack_350;
  longlong lStack_348;
  longlong local_330;
  longlong lStack_328;
  longlong local_320;
  longlong lStack_318;
  longlong local_310;
  longlong lStack_308;
  int local_300;
  int iStack_2fc;
  int iStack_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int iStack_2e8;
  int iStack_2e4;
  int local_2e0;
  int iStack_2dc;
  int iStack_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  int local_2c0;
  int iStack_2bc;
  int iStack_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int iStack_2a8;
  int iStack_2a4;
  int local_2a0;
  int iStack_29c;
  int iStack_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int iStack_288;
  int iStack_284;
  __m256i local_280;
  __m256i local_260;
  __m256i local_240;
  __m256i local_220;
  __m256i local_200;
  int local_1e0;
  int iStack_1dc;
  int iStack_1d8;
  int iStack_1d4;
  int local_1d0;
  int iStack_1cc;
  int iStack_1c8;
  int iStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint local_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  __m256i local_1a0;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint local_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  int local_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  int local_150;
  int iStack_14c;
  int iStack_148;
  int iStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint local_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  int local_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int local_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint local_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint local_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int local_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  __m256i local_80 [2];
  
  lVar23 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  local_3a0 = 1 << (cos_bit - 1U & 0x1f);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1e0);
  uVar20 = uVar1 & 0xffff;
  local_300 = uVar20 * 0x10001;
  local_2e0 = uVar20 + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1a0);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x220);
  uVar22 = uVar20 << 0x10 | uVar1 & 0xffff;
  iVar21 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  uVar24 = -uVar20 & 0xffff | uVar1 * 0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x180);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x240);
  uVar18 = uVar20 << 0x10 | uVar1 & 0xffff;
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x200);
  uVar3 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1c0);
  uVar19 = uVar3 << 0x10 | uVar2 & 0xffff;
  local_1e0 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  local_1c0 = -uVar20 & 0xffff | uVar1 * 0x10000;
  local_1d0 = (uVar3 & 0xffff) + uVar2 * -0x10000;
  local_1b0 = -uVar3 & 0xffff | uVar2 * 0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x168);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 600);
  local_180 = uVar20 << 0x10 | uVar1 & 0xffff;
  local_160 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x188);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x238);
  local_170 = uVar20 << 0x10 | uVar1 & 0xffff;
  local_524 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1a8);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x218);
  local_140 = uVar20 << 0x10 | uVar1 & 0xffff;
  local_120 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1c8);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1f8);
  local_130 = uVar20 << 0x10 | uVar1 & 0xffff;
  local_380 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1e8);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1d8);
  local_528 = uVar20 << 0x10 | uVar1 & 0xffff;
  local_360 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x208);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x1b8);
  local_f0 = uVar20 << 0x10 | uVar1 & 0xffff;
  local_52c = (uVar20 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x228);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x198);
  local_c0 = uVar20 << 0x10 | uVar1 & 0xffff;
  local_a0 = (uVar20 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x178);
  uVar20 = *(uint *)((long)vert_filter_length_chroma + lVar23 + 0x248);
  local_b0 = uVar1 << 0x10 | uVar20 & 0xffff;
  local_90 = (uVar1 & 0xffff) + uVar20 * -0x10000;
  auVar36._4_4_ = uVar22;
  auVar36._0_4_ = uVar22;
  auVar36._8_4_ = uVar22;
  auVar36._12_4_ = uVar22;
  auVar37._4_4_ = uVar24;
  auVar37._0_4_ = uVar24;
  auVar37._8_4_ = uVar24;
  auVar37._12_4_ = uVar24;
  local_280._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar36;
  local_280._16_16_ = ZEXT116(1) * auVar37;
  auVar38._4_4_ = iVar21;
  auVar38._0_4_ = iVar21;
  auVar38._8_4_ = iVar21;
  auVar38._12_4_ = iVar21;
  local_260._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar38;
  local_260._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar36;
  local_200[0]._4_4_ = uVar18;
  local_200[0]._0_4_ = uVar18;
  local_200[1]._0_4_ = uVar18;
  local_200[1]._4_4_ = uVar18;
  local_200[2]._4_4_ = uVar19;
  local_200[2]._0_4_ = uVar19;
  local_200[3]._0_4_ = uVar19;
  local_200[3]._4_4_ = uVar19;
  local_4c0._16_8_ = input[6][0];
  local_4c0._0_16_ = (undefined1  [16])input[2];
  local_4c0._24_8_ = input[6][1];
  local_480._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xc] + ZEXT116(1) * (undefined1  [16])input[1];
  local_480._16_16_ = ZEXT116(1) * (undefined1  [16])input[0xc];
  local_4e0._16_8_ = input[0xe][0];
  local_4e0._0_16_ = (undefined1  [16])input[10];
  local_4e0._24_8_ = input[0xe][1];
  auVar25._0_16_ = ZEXT116(0) * (undefined1  [16])input[9] + ZEXT116(1) * (undefined1  [16])input[1]
  ;
  auVar25._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[9];
  auVar29._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xb] + ZEXT116(1) * (undefined1  [16])input[3];
  auVar29._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xb];
  local_4a0 = ZEXT1632((undefined1  [16])*input);
  auVar33._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xd] + ZEXT116(1) * (undefined1  [16])input[5];
  auVar33._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xd];
  auVar34._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xf] + ZEXT116(1) * (undefined1  [16])input[7];
  auVar34._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xf];
  auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  local_400 = vpsubsw_avx2(auVar35,auVar34);
  local_3e0 = vpsubsw_avx2(auVar35,auVar29);
  local_3c0._0_16_ = ZEXT116(0) * (undefined1  [16])input[4] + ZEXT116(1) * local_400._0_16_;
  local_3c0._16_16_ = ZEXT116(0) * local_400._16_16_ + ZEXT116(1) * (undefined1  [16])input[4];
  local_80[0]._0_16_ = ZEXT116(1) * (undefined1  [16])input[8] + ZEXT116(0) * local_3e0._0_16_;
  local_80[0]._16_16_ = ZEXT116(1) * local_3e0._16_16_ + ZEXT116(0) * (undefined1  [16])input[8];
  local_520 = vpsubsw_avx2(auVar35,auVar25);
  local_500 = vpsubsw_avx2(auVar35,auVar33);
  local_538 = &local_280;
  local_540 = &local_260;
  local_440._0_8_ = local_240;
  local_460._0_8_ = local_220;
  local_541 = cos_bit;
  local_408 = output;
  iStack_39c = local_3a0;
  iStack_398 = local_3a0;
  iStack_394 = local_3a0;
  iStack_390 = local_3a0;
  iStack_38c = local_3a0;
  iStack_388 = local_3a0;
  iStack_384 = local_3a0;
  iStack_2fc = local_300;
  iStack_2f8 = local_300;
  iStack_2f4 = local_300;
  iStack_2f0 = local_300;
  iStack_2ec = local_300;
  iStack_2e8 = local_300;
  iStack_2e4 = local_300;
  iStack_2dc = local_2e0;
  iStack_2d8 = local_2e0;
  iStack_2d4 = local_2e0;
  iStack_2d0 = local_2e0;
  iStack_2cc = local_2e0;
  iStack_2c8 = local_2e0;
  iStack_2c4 = local_2e0;
  local_2c0 = local_300;
  iStack_2bc = local_300;
  iStack_2b8 = local_300;
  iStack_2b4 = local_300;
  iStack_2b0 = local_300;
  iStack_2ac = local_300;
  iStack_2a8 = local_300;
  iStack_2a4 = local_300;
  local_2a0 = local_2e0;
  iStack_29c = local_2e0;
  iStack_298 = local_2e0;
  iStack_294 = local_2e0;
  iStack_290 = local_2e0;
  iStack_28c = local_2e0;
  iStack_288 = local_2e0;
  iStack_284 = local_2e0;
  local_240 = local_280;
  local_220 = local_260;
  iStack_1dc = local_1e0;
  iStack_1d8 = local_1e0;
  iStack_1d4 = local_1e0;
  iStack_1cc = local_1d0;
  iStack_1c8 = local_1d0;
  iStack_1c4 = local_1d0;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1ac = local_1b0;
  uStack_1a8 = local_1b0;
  uStack_1a4 = local_1b0;
  local_1a0 = local_200;
  uStack_17c = local_180;
  uStack_178 = local_180;
  uStack_174 = local_180;
  uStack_16c = local_170;
  uStack_168 = local_170;
  uStack_164 = local_170;
  iStack_15c = local_160;
  iStack_158 = local_160;
  iStack_154 = local_160;
  local_150 = local_524;
  iStack_14c = local_524;
  iStack_148 = local_524;
  iStack_144 = local_524;
  uStack_13c = local_140;
  uStack_138 = local_140;
  uStack_134 = local_140;
  uStack_12c = local_130;
  uStack_128 = local_130;
  uStack_124 = local_130;
  iStack_11c = local_120;
  iStack_118 = local_120;
  iStack_114 = local_120;
  local_110 = local_380;
  iStack_10c = local_380;
  iStack_108 = local_380;
  iStack_104 = local_380;
  local_100 = local_528;
  uStack_fc = local_528;
  uStack_f8 = local_528;
  uStack_f4 = local_528;
  uStack_ec = local_f0;
  uStack_e8 = local_f0;
  uStack_e4 = local_f0;
  local_e0 = local_360;
  iStack_dc = local_360;
  iStack_d8 = local_360;
  iStack_d4 = local_360;
  local_d0 = local_52c;
  iStack_cc = local_52c;
  iStack_c8 = local_52c;
  iStack_c4 = local_52c;
  uStack_bc = local_c0;
  uStack_b8 = local_c0;
  uStack_b4 = local_c0;
  uStack_ac = local_b0;
  uStack_a8 = local_b0;
  uStack_a4 = local_b0;
  iStack_9c = local_a0;
  iStack_98 = local_a0;
  iStack_94 = local_a0;
  iStack_8c = local_90;
  iStack_88 = local_90;
  iStack_84 = local_90;
  btf_16_avx2((__m256i *)&local_300,(__m256i *)&local_2e0,&local_3c0,local_80,(__m128i *)&local_310,
              (__m128i *)&local_420,(__m128i *)&local_320,(__m128i *)&local_330,
              (__m256i *)&local_3a0,&local_541);
  local_360 = (int)local_310;
  uStack_35c = (undefined4)((ulong)local_310 >> 0x20);
  lStack_358 = lStack_308;
  lStack_350 = local_420;
  lStack_348 = lStack_418;
  local_380 = (int)local_320;
  uStack_37c = (undefined4)((ulong)local_320 >> 0x20);
  lStack_378 = lStack_318;
  lStack_370 = local_330;
  lStack_368 = lStack_328;
  local_3c0 = (__m256i)vperm2f128_avx(local_500,local_4c0,3);
  local_80[0] = (__m256i)vperm2f128_avx(local_520,local_4e0,0x21);
  btf_16_avx2((__m256i *)&local_2c0,(__m256i *)&local_2a0,&local_3c0,local_80,(__m128i *)&local_310,
              (__m128i *)&local_420,(__m128i *)&local_320,(__m128i *)&local_330,
              (__m256i *)&local_3a0,&local_541);
  auVar14._8_8_ = lStack_308;
  auVar14._0_8_ = local_310;
  auVar5._8_8_ = lStack_418;
  auVar5._0_8_ = local_420;
  auVar26._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar14;
  auVar26._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  auVar11._8_8_ = lStack_318;
  auVar11._0_8_ = local_320;
  auVar8._8_8_ = lStack_328;
  auVar8._0_8_ = local_330;
  auVar30._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar11;
  auVar30._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
  auVar25 = vpblendd_avx2(local_400,local_4a0,0xf);
  auVar35._4_4_ = uStack_35c;
  auVar35._0_4_ = local_360;
  auVar35._8_8_ = lStack_358;
  auVar35._16_8_ = lStack_350;
  auVar35._24_8_ = lStack_348;
  local_400 = vpaddsw_avx2(auVar25,auVar35);
  local_4a0 = vpsubsw_avx2(auVar25,auVar35);
  auVar35 = vpblendd_avx2(local_3e0,local_480,0xf0);
  auVar4._4_4_ = uStack_37c;
  auVar4._0_4_ = local_380;
  auVar4._8_8_ = lStack_378;
  auVar4._16_8_ = lStack_370;
  auVar4._24_8_ = lStack_368;
  auVar25 = vpaddsw_avx2(auVar35,auVar4);
  auVar35 = vpsubsw_avx2(auVar35,auVar4);
  auVar4 = vpblendd_avx2(local_520,local_4e0,0xf0);
  local_480 = vpaddsw_avx2(auVar4,auVar26);
  local_520 = vpsubsw_avx2(auVar4,auVar26);
  auVar4 = vpblendd_avx2(local_500,local_4c0,0xf);
  local_500 = vpaddsw_avx2(auVar4,auVar30);
  local_3e0 = vpsubsw_avx2(auVar4,auVar30);
  local_3c0._0_16_ = ZEXT116(0) * auVar35._0_16_ + ZEXT116(1) * auVar25._0_16_;
  local_3c0._16_16_ = ZEXT116(0) * auVar25._16_16_ + ZEXT116(1) * auVar35._0_16_;
  local_80[0] = (__m256i)vperm2i128_avx2(auVar25,auVar35,0x31);
  btf_16_avx2(local_538,local_540,&local_3c0,local_80,(__m128i *)&local_310,(__m128i *)&local_420,
              (__m128i *)&local_320,(__m128i *)&local_330,(__m256i *)&local_3a0,&local_541);
  local_4c0._8_8_ = lStack_308;
  local_4c0._0_8_ = local_310;
  local_4c0._16_8_ = local_420;
  local_4c0._24_8_ = lStack_418;
  local_4e0._8_8_ = lStack_318;
  local_4e0._0_8_ = local_320;
  local_4e0._16_8_ = local_330;
  local_4e0._24_8_ = lStack_328;
  local_3c0[2] = SUB168(local_3e0._0_16_,0);
  local_3c0[3] = SUB168(local_3e0._0_16_,8);
  local_3c0[0] = SUB168(local_500._0_16_,0);
  local_3c0[1] = SUB168(local_500._0_16_,8);
  local_80[0] = (__m256i)vperm2f128_avx(local_500,local_3e0,0x31);
  btf_16_avx2((__m256i *)local_440._0_8_,(__m256i *)local_460._0_8_,&local_3c0,local_80,
              (__m128i *)&local_310,(__m128i *)&local_420,(__m128i *)&local_320,
              (__m128i *)&local_330,(__m256i *)&local_3a0,&local_541);
  auVar15._8_8_ = lStack_308;
  auVar15._0_8_ = local_310;
  auVar6._8_8_ = lStack_418;
  auVar6._0_8_ = local_420;
  auVar27._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar15;
  auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  auVar12._8_8_ = lStack_318;
  auVar12._0_8_ = local_320;
  auVar9._8_8_ = lStack_328;
  auVar9._0_8_ = local_330;
  auVar31._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar12;
  auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
  local_500 = vpaddsw_avx2(local_400,local_4c0);
  local_4c0 = vpsubsw_avx2(local_400,local_4c0);
  local_440 = vpaddsw_avx2(local_4a0,local_4e0);
  local_4e0 = vpsubsw_avx2(local_4a0,local_4e0);
  auVar25 = vpaddsw_avx2(local_480,auVar27);
  local_460 = vpsubsw_avx2(local_480,auVar27);
  auVar35 = vpaddsw_avx2(local_520,auVar31);
  local_4a0 = vpsubsw_avx2(local_520,auVar31);
  local_3c0._0_16_ = ZEXT116(0) * auVar35._0_16_ + ZEXT116(1) * auVar25._0_16_;
  local_3c0._16_16_ = ZEXT116(0) * auVar25._16_16_ + ZEXT116(1) * auVar35._0_16_;
  local_80[0] = (__m256i)vperm2i128_avx2(auVar25,auVar35,0x31);
  btf_16_avx2(&local_200,(__m256i *)&local_1e0,&local_3c0,local_80,(__m128i *)&local_310,
              (__m128i *)&local_420,(__m128i *)&local_320,(__m128i *)&local_330,
              (__m256i *)&local_3a0,&local_541);
  local_520._8_8_ = lStack_308;
  local_520._0_8_ = local_310;
  local_520._16_8_ = local_420;
  local_520._24_8_ = lStack_418;
  local_480._8_8_ = lStack_318;
  local_480._0_8_ = local_320;
  local_480._16_8_ = local_330;
  local_480._24_8_ = lStack_328;
  local_3c0[2] = SUB168(local_4a0._0_16_,0);
  local_3c0[3] = SUB168(local_4a0._0_16_,8);
  local_3c0[0] = SUB168(local_460._0_16_,0);
  local_3c0[1] = SUB168(local_460._0_16_,8);
  local_80[0] = (__m256i)vperm2f128_avx(local_460,local_4a0,0x31);
  btf_16_avx2((__m256i *)&local_1c0,&local_1a0,&local_3c0,local_80,(__m128i *)&local_310,
              (__m128i *)&local_420,(__m128i *)&local_320,(__m128i *)&local_330,
              (__m256i *)&local_3a0,&local_541);
  palVar17 = local_408;
  auVar16._8_8_ = lStack_308;
  auVar16._0_8_ = local_310;
  auVar7._8_8_ = lStack_418;
  auVar7._0_8_ = local_420;
  auVar28._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar16;
  auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
  auVar13._8_8_ = lStack_318;
  auVar13._0_8_ = local_320;
  auVar10._8_8_ = lStack_328;
  auVar10._0_8_ = local_330;
  auVar32._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar13;
  auVar32._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
  auVar25 = vpaddsw_avx2(local_500,local_520);
  local_500 = vpsubsw_avx2(local_500,local_520);
  auVar35 = vpaddsw_avx2(local_440,local_480);
  local_520 = vpsubsw_avx2(local_440,local_480);
  local_440 = vpaddsw_avx2(local_4c0,auVar28);
  local_4c0 = vpsubsw_avx2(local_4c0,auVar28);
  local_460 = vpaddsw_avx2(local_4e0,auVar32);
  local_4e0 = vpsubsw_avx2(local_4e0,auVar32);
  local_3c0._0_16_ = ZEXT116(0) * auVar35._0_16_ + ZEXT116(1) * auVar25._0_16_;
  local_3c0._16_16_ = ZEXT116(0) * auVar25._16_16_ + ZEXT116(1) * auVar35._0_16_;
  local_80[0] = (__m256i)vperm2i128_avx2(auVar25,auVar35,0x31);
  btf_16_avx2((__m256i *)&local_180,(__m256i *)&local_160,&local_3c0,local_80,local_408 + 0xf,
              local_408,local_408 + 0xd,local_408 + 2,(__m256i *)&local_3a0,&local_541);
  local_3c0[2] = SUB168(local_460._0_16_,0);
  local_3c0[3] = SUB168(local_460._0_16_,8);
  local_3c0[0] = SUB168(local_440._0_16_,0);
  local_3c0[1] = SUB168(local_440._0_16_,8);
  local_80[0] = (__m256i)vperm2f128_avx(local_440,local_460,0x31);
  btf_16_avx2((__m256i *)&local_140,(__m256i *)&local_120,&local_3c0,local_80,palVar17 + 0xb,
              palVar17 + 4,palVar17 + 9,palVar17 + 6,(__m256i *)&local_3a0,&local_541);
  local_3c0[2] = SUB168(local_520._0_16_,0);
  local_3c0[3] = SUB168(local_520._0_16_,8);
  local_3c0[0] = SUB168(local_500._0_16_,0);
  local_3c0[1] = SUB168(local_500._0_16_,8);
  local_80[0] = (__m256i)vperm2f128_avx(local_500,local_520,0x31);
  btf_16_avx2((__m256i *)&local_100,(__m256i *)&local_e0,&local_3c0,local_80,palVar17 + 7,
              palVar17 + 8,palVar17 + 5,palVar17 + 10,(__m256i *)&local_3a0,&local_541);
  local_3c0[2] = SUB168(local_4e0._0_16_,0);
  local_3c0[3] = SUB168(local_4e0._0_16_,8);
  local_3c0[0] = SUB168(local_4c0._0_16_,0);
  local_3c0[1] = SUB168(local_4c0._0_16_,8);
  local_80[0] = (__m256i)vperm2f128_avx(local_4c0,local_4e0,0x31);
  btf_16_avx2((__m256i *)&local_c0,(__m256i *)&local_a0,&local_3c0,local_80,palVar17 + 3,
              palVar17 + 0xc,palVar17 + 1,palVar17 + 0xe,(__m256i *)&local_3a0,&local_541);
  return;
}

Assistant:

static inline void fadst8x16_new_avx2(const __m128i *input, __m128i *output,
                                      int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i __rounding_256 = _mm256_set1_epi32(1 << (cos_bit - 1));
  __m256i in0, in1;
  __m128i temp0, temp1, temp2, temp3;

  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);

  __m256i cospi_arr[20];

  cospi_arr[0] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_p32_m32, 0x1);
  cospi_arr[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_p32_m32, 0x1);
  cospi_arr[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p16_p48),
                                         cospi_m48_p16, 0x1);
  cospi_arr[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_m16),
                                         cospi_p16_p48, 0x1);
  cospi_arr[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p16_p48),
                                         cospi_m48_p16, 0x1);
  cospi_arr[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_m16),
                                         cospi_p16_p48, 0x1);
  cospi_arr[8] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p08_p56),
                                         cospi_p40_p24, 0x1);
  cospi_arr[9] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p56_m08),
                                         cospi_p24_m40, 0x1);
  cospi_arr[10] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m56_p08),
                                          cospi_m24_p40, 0x1);
  cospi_arr[11] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p08_p56),
                                          cospi_p40_p24, 0x1);
  cospi_arr[12] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p02_p62),
                                          cospi_p10_p54, 0x1);
  cospi_arr[13] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p62_m02),
                                          cospi_p54_m10, 0x1);
  cospi_arr[14] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p18_p46),
                                          cospi_p26_p38, 0x1);
  cospi_arr[15] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p46_m18),
                                          cospi_p38_m26, 0x1);
  cospi_arr[16] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p34_p30),
                                          cospi_p42_p22, 0x1);
  cospi_arr[17] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p30_m34),
                                          cospi_p22_m42, 0x1);
  cospi_arr[18] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p50_p14),
                                          cospi_p58_p06, 0x1);
  cospi_arr[19] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p14_m50),
                                          cospi_p06_m58, 0x1);

  __m256i x[8];
  x[0] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[0]), input[4], 0x1);
  x[1] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[2]), input[6], 0x1);
  x[2] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[8]), input[12], 0x1);
  x[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[10]), input[14],
                                 0x1);
  x[4] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[1]), input[9], 0x1);
  x[5] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[3]), input[11], 0x1);
  x[6] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[5]), input[13], 0x1);
  x[7] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[7]), input[15], 0x1);

  // stage 1
  __m256i x1[8];
  x1[0] = x[0];
  x1[1] = _mm256_subs_epi16(__zero, x[7]);
  x1[2] = x[2];
  x1[3] = _mm256_subs_epi16(__zero, x[5]);
  x1[4] = _mm256_subs_epi16(__zero, x[4]);
  x1[5] = x[3];
  x1[6] = _mm256_subs_epi16(__zero, x[6]);
  x1[7] = x[1];

  // stage 2
  __m256i x2[8];
  x2[0] = _mm256_blend_epi32(x1[0], x1[1], 0xf0);
  x2[3] = _mm256_blend_epi32(x1[3], x1[2], 0xf0);
  x2[4] = _mm256_blend_epi32(x1[4], x1[5], 0xf0);
  x2[7] = _mm256_blend_epi32(x1[7], x1[6], 0xf0);
  in0 = _mm256_blend_epi32(x1[1], x1[0], 0xf0);
  in1 = _mm256_blend_epi32(x1[2], x1[3], 0xf0);
  btf_16_avx2(&cospi_arr[0], &cospi_arr[1], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x2[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x2[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x1[7], x1[6], 0x21);
  in1 = _mm256_permute2f128_si256(x1[4], x1[5], 0x21);
  btf_16_avx2(&cospi_arr[2], &cospi_arr[3], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x2[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x2[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 3
  __m256i x3[8];
  x3[0] = _mm256_adds_epi16(x2[0], x2[1]);
  x3[1] = _mm256_subs_epi16(x2[0], x2[1]);
  x3[2] = _mm256_adds_epi16(x2[3], x2[2]);
  x3[3] = _mm256_subs_epi16(x2[3], x2[2]);
  x3[4] = _mm256_adds_epi16(x2[4], x2[5]);
  x3[5] = _mm256_subs_epi16(x2[4], x2[5]);
  x3[6] = _mm256_adds_epi16(x2[7], x2[6]);
  x3[7] = _mm256_subs_epi16(x2[7], x2[6]);

  // stage 4
  __m256i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[4] = x3[4];
  x4[5] = x3[5];
  in0 = _mm256_permute2f128_si256(x3[2], x3[3], 0x20);
  in1 = _mm256_permute2f128_si256(x3[2], x3[3], 0x31);
  btf_16_avx2(&cospi_arr[4], &cospi_arr[5], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x4[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x4[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x3[6], x3[7], 0x20);
  in1 = _mm256_permute2f128_si256(x3[6], x3[7], 0x31);
  btf_16_avx2(&cospi_arr[6], &cospi_arr[7], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x4[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x4[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 5
  __m256i x5[8];
  x5[0] = _mm256_adds_epi16(x4[0], x4[2]);
  x5[1] = _mm256_subs_epi16(x4[0], x4[2]);
  x5[2] = _mm256_adds_epi16(x4[1], x4[3]);
  x5[3] = _mm256_subs_epi16(x4[1], x4[3]);
  x5[4] = _mm256_adds_epi16(x4[4], x4[6]);
  x5[5] = _mm256_subs_epi16(x4[4], x4[6]);
  x5[6] = _mm256_adds_epi16(x4[5], x4[7]);
  x5[7] = _mm256_subs_epi16(x4[5], x4[7]);

  // stage 6
  __m256i x6[8];
  x6[0] = x5[0];
  x6[1] = x5[2];
  x6[2] = x5[1];
  x6[3] = x5[3];
  in0 = _mm256_permute2f128_si256(x5[4], x5[6], 0x20);
  in1 = _mm256_permute2f128_si256(x5[4], x5[6], 0x31);
  btf_16_avx2(&cospi_arr[8], &cospi_arr[9], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x6[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x6[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x5[5], x5[7], 0x20);
  in1 = _mm256_permute2f128_si256(x5[5], x5[7], 0x31);
  btf_16_avx2(&cospi_arr[10], &cospi_arr[11], &in0, &in1, &temp0, &temp1,
              &temp2, &temp3, &__rounding_256, &cos_bit);
  x6[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x6[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 7
  __m256i x7[8];
  x7[0] = _mm256_adds_epi16(x6[0], x6[4]);
  x7[1] = _mm256_subs_epi16(x6[0], x6[4]);
  x7[2] = _mm256_adds_epi16(x6[1], x6[5]);
  x7[3] = _mm256_subs_epi16(x6[1], x6[5]);
  x7[4] = _mm256_adds_epi16(x6[2], x6[6]);
  x7[5] = _mm256_subs_epi16(x6[2], x6[6]);
  x7[6] = _mm256_adds_epi16(x6[3], x6[7]);
  x7[7] = _mm256_subs_epi16(x6[3], x6[7]);

  // stage 8
  in0 = _mm256_permute2f128_si256(x7[0], x7[2], 0x20);
  in1 = _mm256_permute2f128_si256(x7[0], x7[2], 0x31);
  btf_16_avx2(&cospi_arr[12], &cospi_arr[13], &in0, &in1, &output[15],
              &output[0], &output[13], &output[2], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[4], x7[6], 0x20);
  in1 = _mm256_permute2f128_si256(x7[4], x7[6], 0x31);
  btf_16_avx2(&cospi_arr[14], &cospi_arr[15], &in0, &in1, &output[11],
              &output[4], &output[9], &output[6], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[1], x7[3], 0x20);
  in1 = _mm256_permute2f128_si256(x7[1], x7[3], 0x31);
  btf_16_avx2(&cospi_arr[16], &cospi_arr[17], &in0, &in1, &output[7],
              &output[8], &output[5], &output[10], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[5], x7[7], 0x20);
  in1 = _mm256_permute2f128_si256(x7[5], x7[7], 0x31);
  btf_16_avx2(&cospi_arr[18], &cospi_arr[19], &in0, &in1, &output[3],
              &output[12], &output[1], &output[14], &__rounding_256, &cos_bit);
}